

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::RunContext::handleUnfinishedSections(RunContext *this)

{
  pointer pSVar1;
  __normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>
  __tmp;
  pointer pSVar2;
  
  pSVar1 = (this->m_unfinishedSections).
           super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2 = (this->m_unfinishedSections).
           super__Vector_base<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  while (pSVar2 != pSVar1) {
    pSVar2 = pSVar2 + -1;
    (*(this->super_IResultCapture)._vptr_IResultCapture[3])(this,pSVar2);
  }
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::clear
            (&this->m_unfinishedSections);
  return;
}

Assistant:

void RunContext::handleUnfinishedSections() {
        // If sections ended prematurely due to an exception we stored their
        // infos here so we can tear them down outside the unwind process.
        for (auto it = m_unfinishedSections.rbegin(),
            itEnd = m_unfinishedSections.rend();
            it != itEnd;
            ++it)
            sectionEnded(*it);
        m_unfinishedSections.clear();
    }